

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::ResetNotificationStrategy::NoResetNotificationCase::iterate(NoResetNotificationCase *this)

{
  ostringstream *poVar1;
  RenderContext *pRVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLint reset;
  int local_1ac;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  bVar3 = checkExtension((this->super_RobustnessBase).super_TestCase.m_context,"GL_KHR_robustness");
  if (bVar3) {
    RobustnessBase::createRobustContext
              (&this->super_RobustnessBase,RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION);
    (*((this->super_RobustnessBase).m_robustContext)->_vptr_RenderContext[8])();
    pRVar2 = ((this->super_RobustnessBase).super_TestCase.m_context)->m_renderCtx;
    iVar4 = (*pRVar2->_vptr_RenderContext[7])(pRVar2,"glGetGraphicsResetStatus");
    if ((code *)CONCAT44(extraout_var,iVar4) == (code *)0x0) {
      this_00 = ((this->super_RobustnessBase).super_TestCase.m_context)->m_testCtx;
      description = "Pointer to function glGetGraphicsResetStatus is NULL.";
      testResult = QP_TEST_RESULT_INTERNAL_ERROR;
    }
    else {
      local_1ac = 0;
      iVar5 = (*((this->super_RobustnessBase).m_robustContext)->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_00,iVar5) + 0x868))(0x8256,&local_1ac);
      err = (**(code **)(CONCAT44(extraout_var_00,iVar5) + 0x800))();
      glu::checkError(err,"glGetIntegerv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                      ,0x85);
      if (local_1ac == 0x8261) {
        iVar4 = (*(code *)CONCAT44(extraout_var,iVar4))();
        if (iVar4 == 0) {
          pRVar2 = (this->super_RobustnessBase).m_robustContext;
          if (pRVar2 != (RenderContext *)0x0) {
            (*pRVar2->_vptr_RenderContext[1])();
            (this->super_RobustnessBase).m_robustContext = (RenderContext *)0x0;
          }
          (*((this->super_RobustnessBase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[8])();
          this_00 = (this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.
                    m_testCtx;
          description = "Pass";
          testResult = QP_TEST_RESULT_PASS;
          goto LAB_008d2e8e;
        }
        local_1a8._0_8_ =
             ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
        poVar1 = (ostringstream *)(local_1a8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Test failed! glGetGraphicsResetStatus returned wrong value [",
                   0x3c);
        std::ostream::operator<<(poVar1,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected ",0xb);
        std::ostream::operator<<(poVar1,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"].",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1a8._0_8_ =
             ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log;
        poVar1 = (ostringstream *)(local_1a8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Test failed! glGet returned wrong value [",0x29);
        std::ostream::operator<<(poVar1,local_1ac);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", expected ",0xb);
        std::ostream::operator<<(poVar1,0x8261);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"].",2);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
      std::ios_base::~ios_base(local_130);
      this_00 = (this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
LAB_008d2e8e:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

virtual IterateResult iterate(void)
	{
		if (!checkExtension(m_context, "GL_KHR_robustness"))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
			return STOP;
		}

		createRobustContext(glu::RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION);
		getRobustContext()->makeCurrent();

		PFNGLGETGRAPHICSRESETSTATUS pGetGraphicsResetStatus =
			(PFNGLGETGRAPHICSRESETSTATUS)m_context.getRenderContext().getProcAddress("glGetGraphicsResetStatus");

		if (DE_NULL == pGetGraphicsResetStatus)
		{
			m_context.getTestContext().setTestResult(QP_TEST_RESULT_INTERNAL_ERROR,
													 "Pointer to function glGetGraphicsResetStatus is NULL.");
			return STOP;
		}

		glw::GLint reset = 0;

		const glw::Functions& gl = getRobustContext()->getFunctions();
		gl.getIntegerv(GL_RESET_NOTIFICATION_STRATEGY, &reset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv");

		if (reset != GL_NO_RESET_NOTIFICATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! glGet returned wrong value [" << reset
							   << ", expected " << GL_NO_RESET_NOTIFICATION << "]." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		glw::GLint status = pGetGraphicsResetStatus();
		if (status != GL_NO_ERROR)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Test failed! glGetGraphicsResetStatus returned wrong value [" << status
							   << ", expected " << GL_NO_ERROR << "]." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		releaseRobustContext();
		m_context.getRenderContext().makeCurrent();

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}